

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

Format __thiscall QRasterBuffer::prepare(QRasterBuffer *this,QImage *image)

{
  int iVar1;
  int iVar2;
  Format FVar3;
  QRgb QVar4;
  uchar *puVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<unsigned_int> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = QImage::bits(image);
  this->m_buffer = puVar5;
  iVar1 = QImage::width(image);
  if (0x7ffffe < iVar1) {
    iVar1 = 0x7fffff;
  }
  this->m_width = iVar1;
  iVar2 = QImage::height(image);
  iVar1 = 0x7fffff;
  if (iVar2 < 0x7fffff) {
    iVar1 = iVar2;
  }
  this->m_height = iVar1;
  iVar1 = QImage::depth(image);
  this->bytes_per_pixel = iVar1 / 8;
  qVar6 = QImage::bytesPerLine(image);
  this->bytes_per_line = qVar6;
  FVar3 = QImage::format(image);
  this->format = FVar3;
  QImage::colorSpace((QImage *)&local_48);
  QColorSpace::operator=(&this->colorSpace,(QColorSpace *)&local_48);
  QColorSpace::~QColorSpace((QColorSpace *)&local_48);
  iVar1 = QImage::depth(image);
  if (iVar1 == 1) {
    QImage::colorTable((QList<unsigned_int> *)&local_48,image);
    qVar6 = local_48.size;
    QArrayDataPointer<unsigned_int>::~QArrayDataPointer(&local_48);
    if ((undefined1 *)qVar6 == (undefined1 *)0x2) {
      this->monoDestinationWithClut = true;
      local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      QImage::colorTable((QList<unsigned_int> *)&local_48,image);
      QVar4 = qPremultiply(*local_48.ptr);
      this->destColor0 = QVar4;
      QVar4 = qPremultiply(local_48.ptr[1]);
      this->destColor1 = QVar4;
      QArrayDataPointer<unsigned_int>::~QArrayDataPointer(&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this->format;
  }
  __stack_chk_fail();
}

Assistant:

QImage::Format QRasterBuffer::prepare(QImage *image)
{
    m_buffer = (uchar *)image->bits();
    m_width = qMin(QT_RASTER_COORD_LIMIT, image->width());
    m_height = qMin(QT_RASTER_COORD_LIMIT, image->height());
    bytes_per_pixel = image->depth()/8;
    bytes_per_line = image->bytesPerLine();

    format = image->format();
    colorSpace = image->colorSpace();
    if (image->depth() == 1 && image->colorTable().size() == 2) {
        monoDestinationWithClut = true;
        const QList<QRgb> colorTable = image->colorTable();
        destColor0 = qPremultiply(colorTable[0]);
        destColor1 = qPremultiply(colorTable[1]);
    }

    return format;
}